

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O0

void google::protobuf::compiler::java::anon_unknown_6::SetPrimitiveVariables
               (FieldDescriptor *descriptor,int messageBitIndex,int builderBitIndex,
               FieldGeneratorInfo *info,ClassNameResolver *name_resolver,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  bool bVar2;
  uint32_t i32;
  int iVar3;
  Type TVar4;
  JavaType type;
  char *pcVar5;
  mapped_type *pmVar6;
  mapped_type *this;
  size_t u64;
  FieldOptions *pFVar7;
  int bitIndex;
  int bitIndex_00;
  int bitIndex_01;
  int bitIndex_02;
  int bitIndex_03;
  int bitIndex_04;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int bitIndex_05;
  int bitIndex_06;
  int bitIndex_07;
  int bitIndex_08;
  int bitIndex_09;
  int bitIndex_10;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  allocator local_1409;
  key_type local_1408;
  string local_13e8;
  allocator local_13c1;
  key_type local_13c0;
  string local_13a0;
  allocator local_1379;
  key_type local_1378;
  string local_1358;
  allocator local_1331;
  key_type local_1330;
  string local_1310;
  allocator local_12e9;
  key_type local_12e8;
  string local_12c8;
  allocator local_12a1;
  key_type local_12a0;
  string local_1280;
  allocator local_1259;
  key_type local_1258;
  string local_1238;
  allocator local_1211;
  key_type local_1210;
  allocator local_11e9;
  key_type local_11e8;
  allocator local_11c1;
  key_type local_11c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1180;
  allocator local_1159;
  key_type local_1158;
  allocator local_1131;
  key_type local_1130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10f0;
  allocator local_10c9;
  key_type local_10c8;
  allocator local_10a1;
  key_type local_10a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1080;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1060;
  allocator local_1039;
  key_type local_1038;
  allocator local_1011;
  key_type local_1010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ff0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fd0;
  allocator local_fa9;
  key_type local_fa8;
  allocator local_f81;
  key_type local_f80;
  allocator local_f59;
  key_type local_f58;
  allocator local_f31;
  key_type local_f30;
  string local_f10;
  allocator local_ee9;
  key_type local_ee8;
  string local_ec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ea8;
  allocator local_e81;
  key_type local_e80;
  string local_e60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e40;
  allocator local_e19;
  key_type local_e18;
  string local_df8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dd8;
  allocator local_db1;
  key_type local_db0;
  string local_d90;
  allocator local_d69;
  key_type local_d68;
  string local_d48;
  allocator local_d21;
  key_type local_d20;
  allocator local_cf9;
  key_type local_cf8;
  AlphaNum local_cd8;
  string local_ca8;
  int local_c88;
  allocator local_c81;
  int fixed_size;
  byte local_c5e;
  allocator local_c5d;
  byte local_c5c;
  byte local_c5b;
  byte local_c5a;
  allocator local_c59;
  key_type local_c58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c18;
  allocator local_bf1;
  key_type local_bf0;
  allocator local_bc9;
  key_type local_bc8;
  allocator local_ba1;
  key_type local_ba0;
  allocator local_b79;
  key_type local_b78;
  AlphaNum local_b58;
  string local_b28;
  allocator local_b01;
  key_type local_b00;
  AlphaNum local_ae0;
  string local_ab0;
  allocator local_a89;
  key_type local_a88;
  allocator local_a61;
  key_type local_a60;
  byte local_a39;
  string local_a38;
  byte local_a12;
  allocator local_a11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a10;
  allocator local_9e9;
  key_type local_9e8;
  string local_9c8;
  allocator local_9a1;
  key_type local_9a0;
  allocator local_979;
  key_type local_978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_958;
  allocator local_931;
  key_type local_930;
  allocator local_909;
  key_type local_908;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e8;
  allocator local_8c1;
  key_type local_8c0;
  allocator local_899;
  key_type local_898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  allocator local_851;
  key_type local_850;
  allocator local_829;
  key_type local_828;
  allocator local_801;
  key_type local_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  allocator local_779;
  key_type local_778;
  allocator local_751;
  key_type local_750;
  allocator local_729;
  key_type local_728;
  allocator local_701;
  key_type local_700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  allocator local_659;
  key_type local_658;
  allocator local_631;
  key_type local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  allocator local_5c9;
  key_type local_5c8;
  allocator local_5a1;
  key_type local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  allocator local_539;
  key_type local_538;
  allocator local_511;
  key_type local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  allocator local_4a9;
  key_type local_4a8;
  allocator local_481;
  key_type local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  allocator local_419;
  key_type local_418;
  allocator local_3f1;
  key_type local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  allocator local_389;
  key_type local_388;
  allocator local_361;
  key_type local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  allocator local_319;
  key_type local_318;
  allocator local_2f1;
  key_type local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  allocator local_289;
  key_type local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  allocator local_221;
  key_type local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  allocator local_1b9;
  key_type local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  allocator local_151;
  string local_150;
  undefined1 local_130 [8];
  string capitalized_type;
  key_type local_108;
  allocator local_e1;
  key_type local_e0;
  allocator local_b9;
  key_type local_b8;
  allocator local_91;
  key_type local_90;
  allocator local_59;
  key_type local_58;
  JavaType local_34;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmStack_30;
  JavaType javaType;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables_local;
  ClassNameResolver *name_resolver_local;
  FieldGeneratorInfo *info_local;
  int builderBitIndex_local;
  int messageBitIndex_local;
  FieldDescriptor *descriptor_local;
  
  pmStack_30 = variables;
  variables_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)name_resolver;
  name_resolver_local = (ClassNameResolver *)info;
  info_local._0_4_ = builderBitIndex;
  info_local._4_4_ = messageBitIndex;
  _builderBitIndex_local = descriptor;
  SetCommonFieldVariables(descriptor,info,variables);
  local_34 = GetJavaType(_builderBitIndex_local);
  pcVar5 = PrimitiveTypeName(local_34);
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"type",&local_59);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_58);
  std::__cxx11::string::operator=((string *)pmVar6,pcVar5);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  pcVar5 = BoxedPrimitiveTypeName(local_34);
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"boxed_type",&local_91);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_90);
  std::__cxx11::string::operator=((string *)pmVar6,pcVar5);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  pcVar5 = KotlinTypeName(local_34);
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"kt_type",&local_b9);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_b8);
  std::__cxx11::string::operator=((string *)pmVar6,pcVar5);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"type",&local_e1);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_e0);
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_108,"field_type",
             (allocator *)(capitalized_type.field_2._M_local_buf + 0xf));
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[](pmVar1,&local_108);
  std::__cxx11::string::operator=((string *)this,(string *)pmVar6);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)(capitalized_type.field_2._M_local_buf + 0xf))
  ;
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  pmVar1 = pmStack_30;
  if ((((local_34 == JAVATYPE_BOOLEAN) || (local_34 == JAVATYPE_DOUBLE)) ||
      (local_34 == JAVATYPE_FLOAT)) || ((local_34 == JAVATYPE_INT || (local_34 == JAVATYPE_LONG))))
  {
    pcVar5 = PrimitiveTypeName(local_34);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_150,pcVar5,&local_151);
    UnderscoresToCamelCase((string *)local_130,&local_150,true);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
    std::operator+(&local_198,"com.google.protobuf.Internal.",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130);
    std::operator+(&local_178,&local_198,"List");
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1b8,"field_list_type",&local_1b9);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_1b8);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_178);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    std::operator+(&local_200,"empty",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130);
    std::operator+(&local_1e0,&local_200,"List()");
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_220,"empty_list",&local_221);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_220);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_200);
    std::operator+(&local_268,"new",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130);
    std::operator+(&local_248,&local_268,"List()");
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_288,"create_list",&local_289);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_288);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_248);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator((allocator<char> *)&local_289);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2f0,"name",&local_2f1);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_2f0);
    std::operator+(&local_2d0,"mutableCopy(",pmVar6);
    std::operator+(&local_2b0,&local_2d0,"_)");
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_318,"mutable_copy_list",&local_319);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_318);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator((allocator<char> *)&local_319);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_360,"name",&local_361);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_360);
    std::operator+(&local_340,pmVar6,"_.makeImmutable()");
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_388,"name_make_immutable",&local_389);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_388);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_340);
    std::__cxx11::string::~string((string *)&local_388);
    std::allocator<char>::~allocator((allocator<char> *)&local_389);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_360);
    std::allocator<char>::~allocator((allocator<char> *)&local_361);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3f0,"name",&local_3f1);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_3f0);
    std::operator+(&local_3d0,pmVar6,"_.get");
    std::operator+(&local_3b0,&local_3d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_418,"repeated_get",&local_419);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_418);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_418);
    std::allocator<char>::~allocator((allocator<char> *)&local_419);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_480,"name",&local_481);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_480);
    std::operator+(&local_460,pmVar6,"_.add");
    std::operator+(&local_440,&local_460,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4a8,"repeated_add",&local_4a9);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_4a8);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_440);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
    std::__cxx11::string::~string((string *)&local_440);
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::~string((string *)&local_480);
    std::allocator<char>::~allocator((allocator<char> *)&local_481);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_510,"name",&local_511);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_510);
    std::operator+(&local_4f0,pmVar6,"_.set");
    std::operator+(&local_4d0,&local_4f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_538,"repeated_set",&local_539);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_538);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_4d0);
    std::__cxx11::string::~string((string *)&local_538);
    std::allocator<char>::~allocator((allocator<char> *)&local_539);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::__cxx11::string::~string((string *)&local_510);
    std::allocator<char>::~allocator((allocator<char> *)&local_511);
    std::__cxx11::string::~string((string *)local_130);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5a0,"boxed_type",&local_5a1);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_5a0);
    std::operator+(&local_580,"java.util.List<",pmVar6);
    std::operator+(&local_560,&local_580,">");
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5c8,"field_list_type",&local_5c9);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_5c8);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_560);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
    std::__cxx11::string::~string((string *)&local_560);
    std::__cxx11::string::~string((string *)&local_580);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_630,"boxed_type",&local_631);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_630);
    std::operator+(&local_610,"new java.util.ArrayList<",pmVar6);
    std::operator+(&local_5f0,&local_610,">()");
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_658,"create_list",&local_659);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_658);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_5f0);
    std::__cxx11::string::~string((string *)&local_658);
    std::allocator<char>::~allocator((allocator<char> *)&local_659);
    std::__cxx11::string::~string((string *)&local_5f0);
    std::__cxx11::string::~string((string *)&local_610);
    std::__cxx11::string::~string((string *)&local_630);
    std::allocator<char>::~allocator((allocator<char> *)&local_631);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_700,"boxed_type",&local_701);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_700);
    std::operator+(&local_6e0,"new java.util.ArrayList<",pmVar6);
    std::operator+(&local_6c0,&local_6e0,">(");
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_728,"name",&local_729);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_728);
    std::operator+(&local_6a0,&local_6c0,pmVar6);
    std::operator+(&local_680,&local_6a0,"_)");
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_750,"mutable_copy_list",&local_751);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_750);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_680);
    std::__cxx11::string::~string((string *)&local_750);
    std::allocator<char>::~allocator((allocator<char> *)&local_751);
    std::__cxx11::string::~string((string *)&local_680);
    std::__cxx11::string::~string((string *)&local_6a0);
    std::__cxx11::string::~string((string *)&local_728);
    std::allocator<char>::~allocator((allocator<char> *)&local_729);
    std::__cxx11::string::~string((string *)&local_6c0);
    std::__cxx11::string::~string((string *)&local_6e0);
    std::__cxx11::string::~string((string *)&local_700);
    std::allocator<char>::~allocator((allocator<char> *)&local_701);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_778,"empty_list",&local_779);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_778);
    std::__cxx11::string::operator=((string *)pmVar6,"java.util.Collections.emptyList()");
    std::__cxx11::string::~string((string *)&local_778);
    std::allocator<char>::~allocator((allocator<char> *)&local_779);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_800,"name",&local_801);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_800);
    std::operator+(&local_7e0,pmVar6,"_ = java.util.Collections.unmodifiableList(");
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_828,"name",&local_829);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_828);
    std::operator+(&local_7c0,&local_7e0,pmVar6);
    std::operator+(&local_7a0,&local_7c0,"_)");
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_850,"name_make_immutable",&local_851);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_850);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_7a0);
    std::__cxx11::string::~string((string *)&local_850);
    std::allocator<char>::~allocator((allocator<char> *)&local_851);
    std::__cxx11::string::~string((string *)&local_7a0);
    std::__cxx11::string::~string((string *)&local_7c0);
    std::__cxx11::string::~string((string *)&local_828);
    std::allocator<char>::~allocator((allocator<char> *)&local_829);
    std::__cxx11::string::~string((string *)&local_7e0);
    std::__cxx11::string::~string((string *)&local_800);
    std::allocator<char>::~allocator((allocator<char> *)&local_801);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_898,"name",&local_899);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_898);
    std::operator+(&local_878,pmVar6,"_.get");
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_8c0,"repeated_get",&local_8c1);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_8c0);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_878);
    std::__cxx11::string::~string((string *)&local_8c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_8c1);
    std::__cxx11::string::~string((string *)&local_878);
    std::__cxx11::string::~string((string *)&local_898);
    std::allocator<char>::~allocator((allocator<char> *)&local_899);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_908,"name",&local_909);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_908);
    std::operator+(&local_8e8,pmVar6,"_.add");
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_930,"repeated_add",&local_931);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_930);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_8e8);
    std::__cxx11::string::~string((string *)&local_930);
    std::allocator<char>::~allocator((allocator<char> *)&local_931);
    std::__cxx11::string::~string((string *)&local_8e8);
    std::__cxx11::string::~string((string *)&local_908);
    std::allocator<char>::~allocator((allocator<char> *)&local_909);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_978,"name",&local_979);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_978);
    std::operator+(&local_958,pmVar6,"_.set");
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_9a0,"repeated_set",&local_9a1);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_9a0);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_958);
    std::__cxx11::string::~string((string *)&local_9a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_9a1);
    std::__cxx11::string::~string((string *)&local_958);
    std::__cxx11::string::~string((string *)&local_978);
    std::allocator<char>::~allocator((allocator<char> *)&local_979);
  }
  ImmutableDefaultValue_abi_cxx11_
            (&local_9c8,(java *)_builderBitIndex_local,(FieldDescriptor *)variables_local,
             (ClassNameResolver *)info);
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9e8,"default",&local_9e9);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_9e8);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_9c8);
  std::__cxx11::string::~string((string *)&local_9e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9e9);
  std::__cxx11::string::~string((string *)&local_9c8);
  bVar2 = IsDefaultValueJavaDefault(_builderBitIndex_local);
  local_a12 = 0;
  local_a39 = 0;
  if (bVar2) {
    std::allocator<char>::allocator();
    local_a12 = 1;
    std::__cxx11::string::string((string *)&local_a10,"",&local_a11);
  }
  else {
    ImmutableDefaultValue_abi_cxx11_
              (&local_a38,(java *)_builderBitIndex_local,(FieldDescriptor *)variables_local,
               (ClassNameResolver *)info);
    local_a39 = 1;
    std::operator+(&local_a10,"= ",&local_a38);
  }
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a60,"default_init",&local_a61);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_a60);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_a10);
  std::__cxx11::string::~string((string *)&local_a60);
  std::allocator<char>::~allocator((allocator<char> *)&local_a61);
  std::__cxx11::string::~string((string *)&local_a10);
  if ((local_a39 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a38);
  }
  if ((local_a12 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_a11);
  }
  pcVar5 = GetCapitalizedType(_builderBitIndex_local,true);
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a88,"capitalized_type",&local_a89);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_a88);
  std::__cxx11::string::operator=((string *)pmVar6,pcVar5);
  std::__cxx11::string::~string((string *)&local_a88);
  std::allocator<char>::~allocator((allocator<char> *)&local_a89);
  i32 = internal::WireFormat::MakeTag(_builderBitIndex_local);
  strings::AlphaNum::AlphaNum(&local_ae0,i32);
  StrCat_abi_cxx11_(&local_ab0,(protobuf *)&local_ae0,a);
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b00,"tag",&local_b01);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_b00);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_ab0);
  std::__cxx11::string::~string((string *)&local_b00);
  std::allocator<char>::~allocator((allocator<char> *)&local_b01);
  std::__cxx11::string::~string((string *)&local_ab0);
  iVar3 = FieldDescriptor::number(_builderBitIndex_local);
  TVar4 = GetType(_builderBitIndex_local);
  u64 = internal::WireFormat::TagSize(iVar3,TVar4);
  strings::AlphaNum::AlphaNum(&local_b58,u64);
  StrCat_abi_cxx11_(&local_b28,(protobuf *)&local_b58,a_00);
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b78,"tag_size",&local_b79);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_b78);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_b28);
  std::__cxx11::string::~string((string *)&local_b78);
  std::allocator<char>::~allocator((allocator<char> *)&local_b79);
  std::__cxx11::string::~string((string *)&local_b28);
  type = GetJavaType(_builderBitIndex_local);
  bVar2 = IsReferenceType(type);
  pmVar1 = pmStack_30;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_ba0,"null_check",&local_ba1);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_ba0);
    std::__cxx11::string::operator=
              ((string *)pmVar6,
               "  if (value == null) {\n    throw new NullPointerException();\n  }\n");
    std::__cxx11::string::~string((string *)&local_ba0);
    std::allocator<char>::~allocator((allocator<char> *)&local_ba1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_bc8,"null_check",&local_bc9);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_bc8);
    std::__cxx11::string::operator=((string *)pmVar6,"");
    std::__cxx11::string::~string((string *)&local_bc8);
    std::allocator<char>::~allocator((allocator<char> *)&local_bc9);
  }
  pFVar7 = FieldDescriptor::options(_builderBitIndex_local);
  bVar2 = FieldOptions::deprecated(pFVar7);
  pmVar1 = pmStack_30;
  pcVar5 = "";
  if (bVar2) {
    pcVar5 = "@java.lang.Deprecated ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_bf0,"deprecation",&local_bf1);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_bf0);
  std::__cxx11::string::operator=((string *)pmVar6,pcVar5);
  std::__cxx11::string::~string((string *)&local_bf0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bf1);
  pFVar7 = FieldDescriptor::options(_builderBitIndex_local);
  bVar2 = FieldOptions::deprecated(pFVar7);
  pmVar1 = pmStack_30;
  local_c5a = 0;
  local_c5b = 0;
  local_c5c = 0;
  local_c5e = 0;
  if (bVar2) {
    std::allocator<char>::allocator();
    local_c5a = 1;
    std::__cxx11::string::string((string *)&local_c58,"name",&local_c59);
    local_c5b = 1;
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_c58);
    std::operator+(&local_c38,"@kotlin.Deprecated(message = \"Field ",pmVar6);
    local_c5c = 1;
    std::operator+(&local_c18,&local_c38," is deprecated\") ");
  }
  else {
    std::allocator<char>::allocator();
    local_c5e = 1;
    std::__cxx11::string::string((string *)&local_c18,"",&local_c5d);
  }
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&fixed_size,"kt_deprecation",&local_c81);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,(key_type *)&fixed_size);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_c18);
  std::__cxx11::string::~string((string *)&fixed_size);
  std::allocator<char>::~allocator((allocator<char> *)&local_c81);
  std::__cxx11::string::~string((string *)&local_c18);
  if ((local_c5e & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_c5d);
  }
  if ((local_c5c & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_c38);
  }
  if ((local_c5b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_c58);
  }
  if ((local_c5a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_c59);
  }
  TVar4 = GetType(_builderBitIndex_local);
  local_c88 = FixedSize(TVar4);
  if (local_c88 != -1) {
    strings::AlphaNum::AlphaNum(&local_cd8,local_c88);
    StrCat_abi_cxx11_(&local_ca8,(protobuf *)&local_cd8,a_01);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_cf8,"fixed_size",&local_cf9);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_cf8);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_ca8);
    std::__cxx11::string::~string((string *)&local_cf8);
    std::allocator<char>::~allocator((allocator<char> *)&local_cf9);
    std::__cxx11::string::~string((string *)&local_ca8);
  }
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d20,"on_changed",&local_d21);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_d20);
  std::__cxx11::string::operator=((string *)pmVar6,"onChanged();");
  std::__cxx11::string::~string((string *)&local_d20);
  std::allocator<char>::~allocator((allocator<char> *)&local_d21);
  bVar2 = HasHasbit(_builderBitIndex_local);
  pmVar1 = pmStack_30;
  if (bVar2) {
    GenerateGetBit_abi_cxx11_(&local_d48,(java *)(ulong)info_local._4_4_,bitIndex);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d68,"get_has_field_bit_message",&local_d69);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_d68);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_d48);
    std::__cxx11::string::~string((string *)&local_d68);
    std::allocator<char>::~allocator((allocator<char> *)&local_d69);
    std::__cxx11::string::~string((string *)&local_d48);
    GenerateGetBit_abi_cxx11_(&local_d90,(java *)(ulong)(uint)info_local,bitIndex_00);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_db0,"get_has_field_bit_builder",&local_db1);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_db0);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_d90);
    std::__cxx11::string::~string((string *)&local_db0);
    std::allocator<char>::~allocator((allocator<char> *)&local_db1);
    std::__cxx11::string::~string((string *)&local_d90);
    GenerateSetBit_abi_cxx11_(&local_df8,(java *)(ulong)info_local._4_4_,bitIndex_01);
    std::operator+(&local_dd8,&local_df8,";");
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e18,"set_has_field_bit_message",&local_e19);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_e18);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_dd8);
    std::__cxx11::string::~string((string *)&local_e18);
    std::allocator<char>::~allocator((allocator<char> *)&local_e19);
    std::__cxx11::string::~string((string *)&local_dd8);
    std::__cxx11::string::~string((string *)&local_df8);
    GenerateSetBit_abi_cxx11_(&local_e60,(java *)(ulong)(uint)info_local,bitIndex_02);
    std::operator+(&local_e40,&local_e60,";");
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e80,"set_has_field_bit_builder",&local_e81);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_e80);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_e40);
    std::__cxx11::string::~string((string *)&local_e80);
    std::allocator<char>::~allocator((allocator<char> *)&local_e81);
    std::__cxx11::string::~string((string *)&local_e40);
    std::__cxx11::string::~string((string *)&local_e60);
    GenerateClearBit_abi_cxx11_(&local_ec8,(java *)(ulong)(uint)info_local,bitIndex_03);
    std::operator+(&local_ea8,&local_ec8,";");
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_ee8,"clear_has_field_bit_builder",&local_ee9);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_ee8);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_ea8);
    std::__cxx11::string::~string((string *)&local_ee8);
    std::allocator<char>::~allocator((allocator<char> *)&local_ee9);
    std::__cxx11::string::~string((string *)&local_ea8);
    std::__cxx11::string::~string((string *)&local_ec8);
    GenerateGetBit_abi_cxx11_(&local_f10,(java *)(ulong)info_local._4_4_,bitIndex_04);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f30,"is_field_present_message",&local_f31);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_f30);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_f10);
    std::__cxx11::string::~string((string *)&local_f30);
    std::allocator<char>::~allocator((allocator<char> *)&local_f31);
    std::__cxx11::string::~string((string *)&local_f10);
    iVar3 = extraout_EDX;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f58,"set_has_field_bit_message",&local_f59);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_f58);
    std::__cxx11::string::operator=((string *)pmVar6,"");
    std::__cxx11::string::~string((string *)&local_f58);
    std::allocator<char>::~allocator((allocator<char> *)&local_f59);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f80,"set_has_field_bit_builder",&local_f81);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_f80);
    std::__cxx11::string::operator=((string *)pmVar6,"");
    std::__cxx11::string::~string((string *)&local_f80);
    std::allocator<char>::~allocator((allocator<char> *)&local_f81);
    pmVar1 = pmStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_fa8,"clear_has_field_bit_builder",&local_fa9);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_fa8);
    std::__cxx11::string::operator=((string *)pmVar6,"");
    std::__cxx11::string::~string((string *)&local_fa8);
    std::allocator<char>::~allocator((allocator<char> *)&local_fa9);
    TVar4 = FieldDescriptor::type(_builderBitIndex_local);
    pmVar1 = pmStack_30;
    if (TVar4 == TYPE_DOUBLE) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1130,"name",&local_1131);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&local_1130);
      std::operator+(&local_1110,"java.lang.Double.doubleToRawLongBits(",pmVar6);
      std::operator+(&local_10f0,&local_1110,"_) != 0");
      pmVar1 = pmStack_30;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1158,"is_field_present_message",&local_1159);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&local_1158);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_10f0);
      std::__cxx11::string::~string((string *)&local_1158);
      std::allocator<char>::~allocator((allocator<char> *)&local_1159);
      std::__cxx11::string::~string((string *)&local_10f0);
      std::__cxx11::string::~string((string *)&local_1110);
      std::__cxx11::string::~string((string *)&local_1130);
      std::allocator<char>::~allocator((allocator<char> *)&local_1131);
      iVar3 = extraout_EDX_02;
    }
    else if (TVar4 == TYPE_FLOAT) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_10a0,"name",&local_10a1);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&local_10a0);
      std::operator+(&local_1080,"java.lang.Float.floatToRawIntBits(",pmVar6);
      std::operator+(&local_1060,&local_1080,"_) != 0");
      pmVar1 = pmStack_30;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_10c8,"is_field_present_message",&local_10c9);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&local_10c8);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_1060);
      std::__cxx11::string::~string((string *)&local_10c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_10c9);
      std::__cxx11::string::~string((string *)&local_1060);
      std::__cxx11::string::~string((string *)&local_1080);
      std::__cxx11::string::~string((string *)&local_10a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_10a1);
      iVar3 = extraout_EDX_01;
    }
    else if (TVar4 == TYPE_BYTES) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1010,"name",&local_1011);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&local_1010);
      std::operator+(&local_ff0,"!",pmVar6);
      std::operator+(&local_fd0,&local_ff0,"_.isEmpty()");
      pmVar1 = pmStack_30;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1038,"is_field_present_message",&local_1039);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&local_1038);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_fd0);
      std::__cxx11::string::~string((string *)&local_1038);
      std::allocator<char>::~allocator((allocator<char> *)&local_1039);
      std::__cxx11::string::~string((string *)&local_fd0);
      std::__cxx11::string::~string((string *)&local_ff0);
      std::__cxx11::string::~string((string *)&local_1010);
      std::allocator<char>::~allocator((allocator<char> *)&local_1011);
      iVar3 = extraout_EDX_00;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_11c0,"name",&local_11c1);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&local_11c0);
      std::operator+(&local_11a0,pmVar6,"_ != ");
      pmVar1 = pmStack_30;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_11e8,"default",&local_11e9);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&local_11e8);
      std::operator+(&local_1180,&local_11a0,pmVar6);
      pmVar1 = pmStack_30;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1210,"is_field_present_message",&local_1211);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&local_1210);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_1180);
      std::__cxx11::string::~string((string *)&local_1210);
      std::allocator<char>::~allocator((allocator<char> *)&local_1211);
      std::__cxx11::string::~string((string *)&local_1180);
      std::__cxx11::string::~string((string *)&local_11e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_11e9);
      std::__cxx11::string::~string((string *)&local_11a0);
      std::__cxx11::string::~string((string *)&local_11c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_11c1);
      iVar3 = extraout_EDX_03;
    }
  }
  GenerateGetBit_abi_cxx11_(&local_1238,(java *)(ulong)(uint)info_local,iVar3);
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1258,"get_mutable_bit_builder",&local_1259);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_1258);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_1238);
  std::__cxx11::string::~string((string *)&local_1258);
  std::allocator<char>::~allocator((allocator<char> *)&local_1259);
  std::__cxx11::string::~string((string *)&local_1238);
  GenerateSetBit_abi_cxx11_(&local_1280,(java *)(ulong)(uint)info_local,bitIndex_05);
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_12a0,"set_mutable_bit_builder",&local_12a1);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_12a0);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_1280);
  std::__cxx11::string::~string((string *)&local_12a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_12a1);
  std::__cxx11::string::~string((string *)&local_1280);
  GenerateClearBit_abi_cxx11_(&local_12c8,(java *)(ulong)(uint)info_local,bitIndex_06);
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_12e8,"clear_mutable_bit_builder",&local_12e9);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_12e8);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_12c8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_12e9);
  std::__cxx11::string::~string((string *)&local_12c8);
  GenerateGetBitMutableLocal_abi_cxx11_(&local_1310,(java *)(ulong)(uint)info_local,bitIndex_07);
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1330,"get_mutable_bit_parser",&local_1331);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_1330);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_1310);
  std::__cxx11::string::~string((string *)&local_1330);
  std::allocator<char>::~allocator((allocator<char> *)&local_1331);
  std::__cxx11::string::~string((string *)&local_1310);
  GenerateSetBitMutableLocal_abi_cxx11_(&local_1358,(java *)(ulong)(uint)info_local,bitIndex_08);
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1378,"set_mutable_bit_parser",&local_1379);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_1378);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_1358);
  std::__cxx11::string::~string((string *)&local_1378);
  std::allocator<char>::~allocator((allocator<char> *)&local_1379);
  std::__cxx11::string::~string((string *)&local_1358);
  GenerateGetBitFromLocal_abi_cxx11_(&local_13a0,(java *)(ulong)(uint)info_local,bitIndex_09);
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_13c0,"get_has_field_bit_from_local",&local_13c1);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_13c0);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_13a0);
  std::__cxx11::string::~string((string *)&local_13c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_13c1);
  std::__cxx11::string::~string((string *)&local_13a0);
  GenerateSetBitToLocal_abi_cxx11_(&local_13e8,(java *)(ulong)info_local._4_4_,bitIndex_10);
  pmVar1 = pmStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1408,"set_has_field_bit_to_local",&local_1409);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_1408);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_13e8);
  std::__cxx11::string::~string((string *)&local_1408);
  std::allocator<char>::~allocator((allocator<char> *)&local_1409);
  std::__cxx11::string::~string((string *)&local_13e8);
  return;
}

Assistant:

void SetPrimitiveVariables(const FieldDescriptor* descriptor,
                           int messageBitIndex, int builderBitIndex,
                           const FieldGeneratorInfo* info,
                           ClassNameResolver* name_resolver,
                           std::map<std::string, std::string>* variables) {
  SetCommonFieldVariables(descriptor, info, variables);

  (*variables)["empty_list"] = "com.google.protobuf.LazyStringArrayList.EMPTY";

  (*variables)["default"] = ImmutableDefaultValue(descriptor, name_resolver);
  (*variables)["default_init"] =
      "= " + ImmutableDefaultValue(descriptor, name_resolver);
  (*variables)["capitalized_type"] = "String";
  (*variables)["tag"] =
      StrCat(static_cast<int32_t>(WireFormat::MakeTag(descriptor)));
  (*variables)["tag_size"] = StrCat(
      WireFormat::TagSize(descriptor->number(), GetType(descriptor)));
  (*variables)["null_check"] =
      "  if (value == null) {\n"
      "    throw new NullPointerException();\n"
      "  }\n";
  (*variables)["isStringEmpty"] = "com.google.protobuf.GeneratedMessage" +
                                  GeneratedCodeVersionSuffix() +
                                  ".isStringEmpty";
  (*variables)["writeString"] = "com.google.protobuf.GeneratedMessage" +
                                GeneratedCodeVersionSuffix() + ".writeString";
  (*variables)["computeStringSize"] = "com.google.protobuf.GeneratedMessage" +
                                      GeneratedCodeVersionSuffix() +
                                      ".computeStringSize";

  // TODO(birdo): Add @deprecated javadoc when generating javadoc is supported
  // by the proto compiler
  (*variables)["deprecation"] =
      descriptor->options().deprecated() ? "@java.lang.Deprecated " : "";
  (*variables)["kt_deprecation"] =
      descriptor->options().deprecated()
          ? "@kotlin.Deprecated(message = \"Field " + (*variables)["name"] +
                " is deprecated\") "
          : "";
  (*variables)["on_changed"] = "onChanged();";

  if (HasHasbit(descriptor)) {
    // For singular messages and builders, one bit is used for the hasField bit.
    (*variables)["get_has_field_bit_message"] = GenerateGetBit(messageBitIndex);
    (*variables)["get_has_field_bit_builder"] = GenerateGetBit(builderBitIndex);

    // Note that these have a trailing ";".
    (*variables)["set_has_field_bit_message"] =
        GenerateSetBit(messageBitIndex) + ";";
    (*variables)["set_has_field_bit_builder"] =
        GenerateSetBit(builderBitIndex) + ";";
    (*variables)["clear_has_field_bit_builder"] =
        GenerateClearBit(builderBitIndex) + ";";

    (*variables)["is_field_present_message"] = GenerateGetBit(messageBitIndex);
  } else {
    (*variables)["set_has_field_bit_message"] = "";
    (*variables)["set_has_field_bit_builder"] = "";
    (*variables)["clear_has_field_bit_builder"] = "";

    (*variables)["is_field_present_message"] =
        "!" + (*variables)["isStringEmpty"] + "(" + (*variables)["name"] + "_)";
  }

  // For repeated builders, one bit is used for whether the array is immutable.
  (*variables)["get_mutable_bit_builder"] = GenerateGetBit(builderBitIndex);
  (*variables)["set_mutable_bit_builder"] = GenerateSetBit(builderBitIndex);
  (*variables)["clear_mutable_bit_builder"] = GenerateClearBit(builderBitIndex);

  // For repeated fields, one bit is used for whether the array is immutable
  // in the parsing constructor.
  (*variables)["get_mutable_bit_parser"] =
      GenerateGetBitMutableLocal(builderBitIndex);
  (*variables)["set_mutable_bit_parser"] =
      GenerateSetBitMutableLocal(builderBitIndex);

  (*variables)["get_has_field_bit_from_local"] =
      GenerateGetBitFromLocal(builderBitIndex);
  (*variables)["set_has_field_bit_to_local"] =
      GenerateSetBitToLocal(messageBitIndex);
}